

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

int __thiscall
QSocks5SocketEngine::accept
          (QSocks5SocketEngine *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  long lVar1;
  QLatin1StringView latin1;
  QSocks5SocketEnginePrivate *socketDescriptor;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  qintptr sd;
  QSocks5SocketEnginePrivate *d;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socks5BindStore>_>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  Socks5State error;
  QObject *this_00;
  QString *this_01;
  undefined1 in_stack_ffffffffffffff90 [16];
  QSocks5BindStore *this_02;
  int iVar3;
  qsizetype qVar4;
  QSocks5BindData *bindData;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  socketDescriptor = d_func((QSocks5SocketEngine *)0x373960);
  this_02 = in_stack_ffffffffffffff90._8_8_;
  this_00 = in_stack_ffffffffffffff90._0_8_;
  qVar4 = -1;
  error = socketDescriptor->socks5State;
  if (error == BindSuccess) {
    QObject::disconnect(this_00,(char *)CONCAT44(9,in_stack_ffffffffffffff88),(QObject *)this,
                        (char *)in_stack_ffffffffffffff78);
    QObject::setParent((QObject *)socketDescriptor->data->controlSocket);
    QHostAddress::operator=((QHostAddress *)this,(QHostAddress *)in_stack_ffffffffffffff78);
    socketDescriptor->bindData->localPort =
         (socketDescriptor->super_QAbstractSocketEnginePrivate).localPort;
    bindData = (QSocks5BindData *)socketDescriptor->socketDescriptor;
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socks5BindStore>_>::operator()
              (in_stack_ffffffffffffff78);
    QSocks5BindStore::add(this_02,(qintptr)socketDescriptor,bindData);
    iVar3 = (int)bindData;
    socketDescriptor->data = (QSocks5Data *)0x0;
    socketDescriptor->bindData = (QSocks5BindData *)0x0;
    socketDescriptor->socketDescriptor = 0;
    socketDescriptor->socks5State = Uninitialized;
    (socketDescriptor->super_QAbstractSocketEnginePrivate).socketState = UnconnectedState;
  }
  else if (error == ControlSocketError) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(10,in_stack_ffffffffffffff88),(size_t)this);
    QVar2.m_data = (char *)socketDescriptor;
    QVar2.m_size = qVar4;
    QString::QString((QString *)this_00,QVar2);
    iVar3 = (int)qVar4;
    QAbstractSocketEngine::setError((QAbstractSocketEngine *)this_00,error,(QString *)this);
    QString::~QString((QString *)0x373adf);
  }
  else {
    QVar2 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT44(error,in_stack_ffffffffffffff88),(size_t)this);
    this_01 = (QString *)QVar2.m_size;
    latin1.m_data = (char *)socketDescriptor;
    latin1.m_size = qVar4;
    QString::QString(this_01,latin1);
    iVar3 = (int)qVar4;
    QAbstractSocketEngine::setError((QAbstractSocketEngine *)this_01,error,(QString *)this);
    QString::~QString((QString *)0x373b2e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

qintptr QSocks5SocketEngine::accept()
{
    Q_D(QSocks5SocketEngine);
    // check we are listing ---

    QSOCKS5_Q_DEBUG << "accept()";

    qintptr sd = -1;
    switch (d->socks5State) {
    case QSocks5SocketEnginePrivate::BindSuccess:
        QSOCKS5_Q_DEBUG << "BindSuccess adding" << d->socketDescriptor << "to the bind store";
        d->data->controlSocket->disconnect();
        d->data->controlSocket->setParent(nullptr);
        d->bindData->localAddress = d->localAddress;
        d->bindData->localPort = d->localPort;
        sd = d->socketDescriptor;
        socks5BindStore()->add(sd, d->bindData);
        d->data = nullptr;
        d->bindData = nullptr;
        d->socketDescriptor = 0;
        //### do something about this socket layer ... set it closed and an error about why ...
        // reset state and local port/address
        d->socks5State = QSocks5SocketEnginePrivate::Uninitialized; // ..??
        d->socketState = QAbstractSocket::UnconnectedState;
        break;
    case QSocks5SocketEnginePrivate::ControlSocketError:
        setError(QAbstractSocket::ProxyProtocolError, "Control socket error"_L1);
        break;
    default:
        setError(QAbstractSocket::ProxyProtocolError, "SOCKS5 proxy error"_L1);
        break;
    }
    return sd;
}